

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::RGB,pstd::pmr::polymorphic_allocator<pbrt::RGB>>::vector<pbrt::RGB_const*>
          (vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *this,RGB *first,
          RGB *last,polymorphic_allocator<pbrt::RGB> *alloc)

{
  undefined8 *in_RCX;
  vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *in_RDX;
  vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *in_RSI;
  polymorphic_allocator<pbrt::RGB> *in_RDI;
  RGB *iter;
  size_t i;
  vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *local_30;
  long local_28;
  
  in_RDI->memoryResource = (memory_resource *)*in_RCX;
  in_RDI[1].memoryResource = (memory_resource *)0x0;
  in_RDI[2].memoryResource = (memory_resource *)0x0;
  in_RDI[3].memoryResource = (memory_resource *)0x0;
  local_30 = in_RSI;
  vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_>::reserve(in_RSI,(size_t)in_RDX);
  local_28 = 0;
  for (; local_30 != in_RDX;
      local_30 = (vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *)
                 ((long)&local_30->ptr + 4)) {
    pmr::polymorphic_allocator<pbrt::RGB>::construct<pbrt::RGB,pbrt::RGB_const&>
              (in_RDI,(RGB *)((long)in_RDI[1].memoryResource + local_28 * 0xc),(RGB *)local_30);
    local_28 = local_28 + 1;
  }
  in_RDI[3].memoryResource = in_RDI[2].memoryResource;
  return;
}

Assistant:

vector(InputIt first, InputIt last, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(last - first);
        size_t i = 0;
        for (InputIt iter = first; iter != last; ++iter, ++i)
            this->alloc.template construct<T>(ptr + i, *iter);
        nStored = nAlloc;
    }